

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

char * getInmateName(char ch)

{
  if ((byte)(ch + 0x9fU) < 0x13) {
    return &DAT_00105080 + *(int *)(&DAT_00105080 + (ulong)(byte)(ch + 0x9fU) * 4);
  }
  return "FAIL";
}

Assistant:

char *getInmateName(char ch) {
    switch (ch) {
        case 'h':
            return "[h]omeboy(10)";
        case 'b':
            return "[b]ruiser(16)";
        case 'l':
            return "[l]unatic(16)";
        case 'f':
            return "[f]fatty(60)";
        case 's':
            return "[s]peedy(10)";
        case 'c':
            return "[c]utie(20)";
        case 'a':
            return "[a]ttorney(30)";
        case 'd':
            return "[d]octor(10)";
        default:
            return "FAIL";
    }
}